

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O3

string * adios2::helper::GetClusterName_abi_cxx11_(void)

{
  long lVar1;
  string *in_RDI;
  string fqdn;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  GetFQDN_abi_cxx11_();
  lVar1 = std::__cxx11::string::rfind((char *)local_30,0x74174e,0);
  if (lVar1 == 0) {
    std::__cxx11::string::find((char)local_30,0x2e);
    std::__cxx11::string::erase((ulong)local_30,0);
  }
  lVar1 = std::__cxx11::string::rfind((char *)local_30,0x741754,0);
  if (lVar1 == 0) {
    std::__cxx11::string::find((char)local_30,0x2e);
    std::__cxx11::string::erase((ulong)local_30,0);
  }
  std::__cxx11::string::find((char)local_30,0x2e);
  std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return in_RDI;
}

Assistant:

std::string GetClusterName() noexcept
{
    std::string fqdn = GetFQDN();
    if (fqdn.rfind("login", 0) == 0)
    {
        fqdn.erase(0, fqdn.find('.') + 1);
    }
    if (fqdn.rfind("batch", 0) == 0)
    {
        fqdn.erase(0, fqdn.find('.') + 1);
    }
    return fqdn.substr(0, fqdn.find('.'));
}